

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void cfd::api::json::DecodeLockingScript::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>_>_>,_bool>
  pVar2;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript> func_table;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript> *in_stack_fffffffffffffbc8;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript> *in_stack_fffffffffffffbd0;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript> *this;
  char (*in_stack_fffffffffffffbd8) [8];
  char (*__args) [10];
  function<void_(cfd::api::json::DecodeLockingScript_&,_const_UniValue_&)>
  *in_stack_fffffffffffffbe0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>_>_>_>
  *this_00;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript> local_361;
  allocator local_2c9;
  value_type local_2c8;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  allocator local_231;
  value_type local_230;
  _Base_ptr local_210;
  undefined1 local_208;
  allocator local_199;
  value_type local_198;
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_101;
  value_type local_100;
  _Base_ptr local_e0;
  undefined1 local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>_>_>_>
  local_60 [2];
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>_>_>_>
                   *)0x6a1893);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>::CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffbd0);
    std::function<std::__cxx11::string(cfd::api::json::DecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeLockingScript_&)>
                *)in_stack_fffffffffffffbe0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeLockingScript_ptr
                *)in_stack_fffffffffffffbd8);
    std::function<void(cfd::api::json::DecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffffbe0,
               (_func_void_DecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffffbd8);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffbe0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>::operator=
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffbd0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>>>>
            ::
            emplace<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffffbe0,(char (*) [4])in_stack_fffffffffffffbd8,
                       in_stack_fffffffffffffbd0);
    local_e0 = (_Base_ptr)pVar2.first._M_node;
    local_d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"asm",&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::function<std::__cxx11::string(cfd::api::json::DecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeLockingScript_&)>
                *)in_stack_fffffffffffffbe0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeLockingScript_ptr
                *)in_stack_fffffffffffffbd8);
    std::function<void(cfd::api::json::DecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffffbe0,
               (_func_void_DecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffffbd8);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffbe0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>::operator=
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffbd0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>>>>
            ::
            emplace<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffffbe0,(char (*) [4])in_stack_fffffffffffffbd8,
                       in_stack_fffffffffffffbd0);
    local_178 = (_Base_ptr)pVar2.first._M_node;
    local_170 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"hex",&local_199);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::function<std::__cxx11::string(cfd::api::json::DecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeLockingScript_&)>
                *)in_stack_fffffffffffffbe0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeLockingScript_ptr
                *)in_stack_fffffffffffffbd8);
    std::function<void(cfd::api::json::DecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffffbe0,
               (_func_void_DecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffffbd8);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffbe0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>::operator=
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffbd0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>>>>
            ::
            emplace<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                       in_stack_fffffffffffffbd0);
    local_210 = (_Base_ptr)pVar2.first._M_node;
    local_208 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"reqSigs",&local_231);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::function<std::__cxx11::string(cfd::api::json::DecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeLockingScript_&)>
                *)in_stack_fffffffffffffbe0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeLockingScript_ptr
                *)in_stack_fffffffffffffbd8);
    std::function<void(cfd::api::json::DecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffffbe0,
               (_func_void_DecodeLockingScript_ptr_UniValue_ptr *)in_stack_fffffffffffffbd8);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffbe0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>::operator=
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffbd0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>_>_>_>
                        *)in_stack_fffffffffffffbe0,(char (*) [5])in_stack_fffffffffffffbd8,
                       in_stack_fffffffffffffbd0);
    local_2a8 = (_Base_ptr)pVar2.first._M_node;
    local_2a0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c8,"type",&local_2c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    __args = (char (*) [10])((long)&local_361.set_function.super__Function_base._M_manager + 1);
    std::function<std::__cxx11::string(cfd::api::json::DecodeLockingScript_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodeLockingScript_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeLockingScript_&)>
                *)in_stack_fffffffffffffbe0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodeLockingScript_ptr
                *)__args);
    std::function<void(cfd::api::json::DecodeLockingScript&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodeLockingScript&,UniValue_const&),void>
              (in_stack_fffffffffffffbe0,(_func_void_DecodeLockingScript_ptr_UniValue_ptr *)__args);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffbe0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    this_00 = local_60;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>::operator=
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffbd0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>>>>
            ::
            emplace<char_const(&)[10],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>&>
                      (this_00,__args,in_stack_fffffffffffffbd0);
    local_361.set_function.super__Function_base._M_functor._1_8_ = pVar2.first._M_node;
    local_361.set_function.super__Function_base._M_functor._M_pod_data[9] = pVar2.second;
    this = &local_361;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               ((long)local_361.get_function.super__Function_base._M_functor._M_pod_data + 1),
               "addresses",(allocator *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,
                (value_type *)
                ((long)local_361.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::__cxx11::string::~string
              ((string *)
               ((long)local_361.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeLockingScript>::~CLASS_FUNCTION_TABLE(this);
  }
  return;
}

Assistant:

void DecodeLockingScript::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<DecodeLockingScript> func_table;  // NOLINT

  func_table = {
    DecodeLockingScript::GetAsmString,
    DecodeLockingScript::SetAsmString,
    DecodeLockingScript::GetAsmFieldType,
  };
  json_mapper.emplace("asm", func_table);
  item_list.push_back("asm");
  func_table = {
    DecodeLockingScript::GetHexString,
    DecodeLockingScript::SetHexString,
    DecodeLockingScript::GetHexFieldType,
  };
  json_mapper.emplace("hex", func_table);
  item_list.push_back("hex");
  func_table = {
    DecodeLockingScript::GetReqSigsString,
    DecodeLockingScript::SetReqSigsString,
    DecodeLockingScript::GetReqSigsFieldType,
  };
  json_mapper.emplace("reqSigs", func_table);
  item_list.push_back("reqSigs");
  func_table = {
    DecodeLockingScript::GetTypeString,
    DecodeLockingScript::SetTypeString,
    DecodeLockingScript::GetTypeFieldType,
  };
  json_mapper.emplace("type", func_table);
  item_list.push_back("type");
  func_table = {
    DecodeLockingScript::GetAddressesString,
    DecodeLockingScript::SetAddressesString,
    DecodeLockingScript::GetAddressesFieldType,
  };
  json_mapper.emplace("addresses", func_table);
  item_list.push_back("addresses");
}